

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_oid.hpp
# Opt level: O1

uint8_t jsoncons::bson::oid_t::parse_hex_char(char hex)

{
  undefined4 uVar1;
  uint8_t uVar2;
  undefined7 in_register_00000039;
  
  uVar2 = '\0';
  uVar1 = (undefined4)CONCAT71(in_register_00000039,hex);
  switch(uVar1) {
  case 0x31:
    uVar2 = '\x01';
    break;
  case 0x32:
    return '\x02';
  case 0x33:
    return '\x03';
  case 0x34:
    return '\x04';
  case 0x35:
    return '\x05';
  case 0x36:
    return '\x06';
  case 0x37:
    return '\a';
  case 0x38:
    return '\b';
  case 0x39:
    return '\t';
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
    break;
  case 0x41:
switchD_0020841c_caseD_41:
    return '\n';
  case 0x42:
switchD_0020841c_caseD_42:
    return '\v';
  case 0x43:
switchD_0020841c_caseD_43:
    return '\f';
  case 0x44:
switchD_0020841c_caseD_44:
    return '\r';
  case 0x45:
switchD_0020841c_caseD_45:
    return '\x0e';
  case 0x46:
switchD_0020841c_caseD_46:
    return '\x0f';
  default:
    switch(uVar1) {
    case 0x61:
      goto switchD_0020841c_caseD_41;
    case 0x62:
      goto switchD_0020841c_caseD_42;
    case 99:
      goto switchD_0020841c_caseD_43;
    case 100:
      goto switchD_0020841c_caseD_44;
    case 0x65:
      goto switchD_0020841c_caseD_45;
    case 0x66:
      goto switchD_0020841c_caseD_46;
    }
  }
  return uVar2;
}

Assistant:

static uint8_t parse_hex_char (char hex)
        {
           switch (hex) {
           case '0':
              return 0;
           case '1':
              return 1;
           case '2':
              return 2;
           case '3':
              return 3;
           case '4':
              return 4;
           case '5':
              return 5;
           case '6':
              return 6;
           case '7':
              return 7;
           case '8':
              return 8;
           case '9':
              return 9;
           case 'a':
           case 'A':
              return 0xa;
           case 'b':
           case 'B':
              return 0xb;
           case 'c':
           case 'C':
              return 0xc;
           case 'd':
           case 'D':
              return 0xd;
           case 'e':
           case 'E':
              return 0xe;
           case 'f':
           case 'F':
              return 0xf;
           default:
              return 0;
           }
        }